

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,int iDb,u8 eCurType)

{
  int iVar1;
  int local_4c;
  Mem *local_40;
  VdbeCursor *local_38;
  VdbeCursor *pCx;
  int nByte;
  Mem *pMem;
  u8 eCurType_local;
  int iDb_local;
  int nField_local;
  int iCur_local;
  Vdbe *p_local;
  
  if (iCur < 1) {
    local_40 = p->aMem;
  }
  else {
    local_40 = p->aMem + (p->nMem - iCur);
  }
  local_38 = (VdbeCursor *)0x0;
  if (eCurType == '\0') {
    local_4c = sqlite3BtreeCursorSize();
  }
  else {
    local_4c = 0;
  }
  if (p->apCsr[iCur] != (VdbeCursor *)0x0) {
    if (p->apCsr[iCur]->pBtx == (Btree *)0x0) {
      p->apCsr[iCur]->field_0x5 = p->apCsr[iCur]->field_0x5 & 0xfe;
    }
    sqlite3VdbeFreeCursor(p,p->apCsr[iCur]);
    p->apCsr[iCur] = (VdbeCursor *)0x0;
  }
  iVar1 = sqlite3VdbeMemClearAndResize(local_40,nField * 8 + 0x78 + local_4c);
  if (iVar1 == 0) {
    local_38 = (VdbeCursor *)local_40->z;
    p->apCsr[iCur] = local_38;
    memset(local_38,0,0x28);
    local_38->eCurType = eCurType;
    local_38->iDb = (i8)iDb;
    local_38->nField = (i16)nField;
    local_38->aOffset = local_38->aType + nField;
    if (eCurType == '\0') {
      (local_38->uc).pCursor = (BtCursor *)(local_40->z + (long)nField * 8 + 0x78);
      sqlite3BtreeCursorZero((local_38->uc).pCursor);
    }
  }
  return local_38;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  int iDb,              /* Database the cursor belongs to, or -1 */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a 
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte = 
      ROUND8(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField + 
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    /* Before calling sqlite3VdbeFreeCursor(), ensure the isEphemeral flag
    ** is clear. Otherwise, if this is an ephemeral cursor created by 
    ** OP_OpenDup, the cursor will not be closed and will still be part
    ** of a BtShared.pCursor list.  */
    if( p->apCsr[iCur]->pBtx==0 ) p->apCsr[iCur]->isEphemeral = 0;
    sqlite3VdbeFreeCursor(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }
  if( SQLITE_OK==sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->z;
    memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
    pCx->eCurType = eCurType;
    pCx->iDb = iDb;
    pCx->nField = nField;
    pCx->aOffset = &pCx->aType[nField];
    if( eCurType==CURTYPE_BTREE ){
      pCx->uc.pCursor = (BtCursor*)
          &pMem->z[ROUND8(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
      sqlite3BtreeCursorZero(pCx->uc.pCursor);
    }
  }
  return pCx;
}